

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

lyxml_elem *
lyxml_dup_elem(ly_ctx *ctx,lyxml_elem *elem,lyxml_elem *parent,int recursive,int with_siblings)

{
  lyxml_attr *attr;
  lyxml_elem *elem_00;
  char *pcVar1;
  lyxml_elem *plVar2;
  lyxml_attr **pplVar3;
  
  if (elem == (lyxml_elem *)0x0) {
    plVar2 = (lyxml_elem *)0x0;
  }
  else {
    plVar2 = (lyxml_elem *)0x0;
    for (; elem != (lyxml_elem *)0x0; elem = elem->next) {
      elem_00 = (lyxml_elem *)calloc(1,0x48);
      if (elem_00 == (lyxml_elem *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_dup_elem");
        return (lyxml_elem *)0x0;
      }
      pcVar1 = lydict_insert(ctx,elem->content,0);
      elem_00->content = pcVar1;
      pcVar1 = lydict_insert(ctx,elem->name,0);
      elem_00->name = pcVar1;
      elem_00->flags = elem->flags;
      elem_00->prev = elem_00;
      if (parent != (lyxml_elem *)0x0) {
        lyxml_add_child(ctx,parent,elem_00);
      }
      elem_00->ns = elem->ns;
      pplVar3 = &elem->attr;
      while (attr = *pplVar3, attr != (lyxml_attr *)0x0) {
        lyxml_dup_attr(ctx,elem_00,attr);
        pplVar3 = &attr->next;
      }
      lyxml_correct_elem_ns(ctx,elem_00,1,0);
      if (recursive != 0) {
        lyxml_dup_elem(ctx,elem->child,elem_00,1,1);
      }
      if (plVar2 == (lyxml_elem *)0x0) {
        plVar2 = elem_00;
      }
      if (with_siblings == 0) {
        return plVar2;
      }
    }
  }
  return plVar2;
}

Assistant:

struct lyxml_elem *
lyxml_dup_elem(struct ly_ctx *ctx, struct lyxml_elem *elem, struct lyxml_elem *parent, int recursive, int with_siblings)
{
    struct lyxml_elem *dup, *result = NULL;
    struct lyxml_attr *attr;

    if (!elem) {
        return NULL;
    }

    LY_TREE_FOR(elem, elem) {
        dup = calloc(1, sizeof *dup);
        LY_CHECK_ERR_RETURN(!dup, LOGMEM(ctx), NULL);
        dup->content = lydict_insert(ctx, elem->content, 0);
        dup->name = lydict_insert(ctx, elem->name, 0);
        dup->flags = elem->flags;
        dup->prev = dup;

        if (parent) {
            lyxml_add_child(ctx, parent, dup);
        }

        /* keep old namespace for now */
        dup->ns = elem->ns;

        /* duplicate attributes */
        for (attr = elem->attr; attr; attr = attr->next) {
            lyxml_dup_attr(ctx, dup, attr);
        }

        /* correct namespaces */
        lyxml_correct_elem_ns(ctx, dup, 1, 0);

        if (recursive) {
            /* duplicate children */
            lyxml_dup_elem(ctx, elem->child, dup, 1, 1);
        }

        /* set result (first sibling) */
        if (!result) {
            result = dup;
        }

        if (!with_siblings) {
            break;
        }
    }

    return result;
}